

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

FxExpression * __thiscall FxIdentifier::Resolve(FxIdentifier *this,FCompileContext *ctx)

{
  BYTE BVar1;
  PStruct *pPVar2;
  PClass *pPVar3;
  PInt *pPVar4;
  int iVar5;
  uint uVar6;
  FxLocalVariableDeclaration *pFVar7;
  FxStackVariable *this_00;
  PClass *pPVar8;
  PField *pPVar9;
  PSymbol *pPVar10;
  undefined4 extraout_var;
  FxSelf *pFVar11;
  FxExpression *pFVar12;
  DObject *this_01;
  undefined4 extraout_var_00;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  FBaseCVar *pFVar13;
  char *pcVar14;
  char *pcVar15;
  FScriptPosition *pFVar16;
  bool bVar17;
  PSymbolTable *symtbl;
  FxExpression *local_40;
  FName local_38 [2];
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  iVar5 = (this->Identifier).Index;
  if ((ctx->Block != (FxCompoundStatement *)0x0) &&
     (local_38[0].Index = iVar5,
     pFVar7 = FxCompoundStatement::FindLocalVariable(ctx->Block,local_38,ctx),
     pFVar7 != (FxLocalVariableDeclaration *)0x0)) {
    if ((pFVar7->super_FxExpression).ExprType == EFX_StaticArray) {
      this_00 = (FxStackVariable *)FMemArena::Alloc(&FxAlloc,0x38);
      (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
      FScriptPosition::FScriptPosition
                (&(this_00->super_FxExpression).ScriptPosition,
                 &(this->super_FxExpression).ScriptPosition);
      (this_00->super_FxExpression).ValueType = (PType *)0x0;
      (this_00->super_FxExpression).isresolved = false;
      (this_00->super_FxExpression).NeedResult = true;
      (this_00->super_FxExpression).ExprType = EFX_StaticArrayVariable;
      (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070c6c0;
      this_00->membervar = (PField *)pFVar7;
      (this_00->super_FxExpression).ValueType = (pFVar7->super_FxExpression).ValueType;
    }
    else {
      BVar1 = ((pFVar7->super_FxExpression).ValueType)->RegType;
      this_00 = (FxStackVariable *)FMemArena::Alloc(&FxAlloc,0x38);
      if (BVar1 == 0x80) {
        FxStackVariable::FxStackVariable
                  (this_00,(pFVar7->super_FxExpression).ValueType,pFVar7->StackOffset,
                   &(this->super_FxExpression).ScriptPosition);
      }
      else {
        (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370
        ;
        FScriptPosition::FScriptPosition
                  (&(this_00->super_FxExpression).ScriptPosition,
                   &(this->super_FxExpression).ScriptPosition);
        (this_00->super_FxExpression).ValueType = (PType *)0x0;
        (this_00->super_FxExpression).isresolved = false;
        (this_00->super_FxExpression).NeedResult = true;
        (this_00->super_FxExpression).ExprType = EFX_LocalVariable;
        (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070c658
        ;
        this_00->membervar = (PField *)pFVar7;
        (this_00->super_FxExpression).ValueType = (pFVar7->super_FxExpression).ValueType;
        this_00->AddressRequested = false;
        *(undefined4 *)&this_00->field_0x34 = 0;
      }
    }
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    UNRECOVERED_JUMPTABLE = (this_00->super_FxExpression)._vptr_FxExpression[2];
LAB_0052eb2a:
    iVar5 = (*UNRECOVERED_JUMPTABLE)(this_00,ctx);
    return (FxExpression *)CONCAT44(extraout_var_01,iVar5);
  }
  pPVar3 = PClassActor::RegistrationInfo.MyClass;
  if (iVar5 == 0x249) {
    pPVar2 = ((ctx->Function->Variants).Array)->SelfClass;
    if (pPVar2 == (PStruct *)0x0) {
      pcVar15 = "Unable to access class defaults from static function";
    }
    else {
      pPVar8 = (pPVar2->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
               super_DObject.Class;
      if (pPVar8 == (PClass *)0x0) {
        pPVar8 = (PClass *)
                 (**(pPVar2->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
                    super_DObject._vptr_DObject)(pPVar2);
        (pPVar2->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
        Class = pPVar8;
      }
      bVar17 = pPVar8 != (PClass *)0x0;
      if (pPVar8 != pPVar3 && bVar17) {
        do {
          pPVar8 = pPVar8->ParentClass;
          bVar17 = pPVar8 != (PClass *)0x0;
          if (pPVar8 == pPVar3) break;
        } while (pPVar8 != (PClass *)0x0);
      }
      if (bVar17) {
        this_00 = (FxStackVariable *)FMemArena::Alloc(&FxAlloc,0x38);
        pPVar9 = (PField *)FMemArena::Alloc(&FxAlloc,0x30);
        pFVar16 = &(this->super_FxExpression).ScriptPosition;
        (pPVar9->super_PSymbol).super_PTypeBase.super_DObject._vptr_DObject =
             (_func_int **)&PTR__FxExpression_0070d370;
        FScriptPosition::FScriptPosition
                  ((FScriptPosition *)&(pPVar9->super_PSymbol).super_PTypeBase.super_DObject.Class,
                   pFVar16);
        (pPVar9->super_PSymbol).super_PTypeBase.super_DObject.GCNext = (DObject *)0x0;
        *(undefined2 *)&(pPVar9->super_PSymbol).super_PTypeBase.super_DObject.ObjectFlags = 0x100;
        *(undefined4 *)&(pPVar9->super_PSymbol).super_PTypeBase.super_DObject.field_0x24 = 0x24;
        (pPVar9->super_PSymbol).super_PTypeBase.super_DObject._vptr_DObject =
             (_func_int **)&PTR__FxExpression_0070c728;
        *(undefined1 *)&pPVar9->Offset = 0;
        (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370
        ;
        FScriptPosition::FScriptPosition(&(this_00->super_FxExpression).ScriptPosition,pFVar16);
        (this_00->super_FxExpression).ValueType = (PType *)0x0;
        (this_00->super_FxExpression).isresolved = false;
        (this_00->super_FxExpression).NeedResult = true;
        (this_00->super_FxExpression).ExprType = EFX_ClassDefaults;
        (this_00->super_FxExpression)._vptr_FxExpression =
             (_func_int **)&PTR__FxClassDefaults_0070c790;
        this_00->membervar = pPVar9;
        this_00->AddressRequested = false;
        (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
        UNRECOVERED_JUMPTABLE = (this_00->super_FxExpression)._vptr_FxExpression[2];
        goto LAB_0052eb2a;
      }
      pcVar15 = "\'Default\' requires an actor type.";
    }
LAB_0052eb48:
    FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,pcVar15);
    goto LAB_0052eb54;
  }
  if ((ctx->Function != (PFunction *)0x0) &&
     (pPVar2 = ((ctx->Function->Variants).Array)->SelfClass, pPVar2 != (PStruct *)0x0)) {
    local_40 = (FxExpression *)CONCAT44(local_40._4_4_,iVar5);
    pPVar10 = PSymbolTable::FindSymbolInTable
                        (&(pPVar2->super_PNamedType).super_PCompoundType.super_PType.Symbols,
                         (FName *)&local_40,(PSymbolTable **)local_38);
    pPVar3 = PField::RegistrationInfo.MyClass;
    if (pPVar10 != (PSymbol *)0x0) {
      pPVar8 = (pPVar10->super_PTypeBase).super_DObject.Class;
      if (pPVar8 == (PClass *)0x0) {
        iVar5 = (**(pPVar10->super_PTypeBase).super_DObject._vptr_DObject)(pPVar10);
        pPVar8 = (PClass *)CONCAT44(extraout_var,iVar5);
        (pPVar10->super_PTypeBase).super_DObject.Class = pPVar8;
      }
      bVar17 = pPVar8 != (PClass *)0x0;
      if (pPVar8 != pPVar3 && bVar17) {
        do {
          pPVar8 = pPVar8->ParentClass;
          bVar17 = pPVar8 != (PClass *)0x0;
          if (pPVar8 == pPVar3) break;
        } while (pPVar8 != (PClass *)0x0);
      }
      if (bVar17) {
        pFVar11 = (FxSelf *)FMemArena::Alloc(&FxAlloc,0x30);
        (pFVar11->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370
        ;
        FScriptPosition::FScriptPosition
                  (&(pFVar11->super_FxExpression).ScriptPosition,
                   &(this->super_FxExpression).ScriptPosition);
        (pFVar11->super_FxExpression).ValueType = (PType *)0x0;
        (pFVar11->super_FxExpression).isresolved = false;
        (pFVar11->super_FxExpression).NeedResult = true;
        (pFVar11->super_FxExpression).ExprType = EFX_Self;
        (pFVar11->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070c728
        ;
        pFVar11->check = false;
        local_40 = FxSelf::Resolve(pFVar11,ctx);
        pPVar2 = ((ctx->Function->Variants).Array)->SelfClass;
        pFVar12 = ResolveMember(this,ctx,pPVar2,&local_40,pPVar2);
        if (pFVar12 != (FxExpression *)0x0) goto LAB_0052ec1d;
        goto LAB_0052eb54;
      }
    }
  }
  if (ctx->Class == (PStruct *)0x0) {
LAB_0052ea8c:
    if (this->noglobal == true) {
      (this->super_FxExpression).ValueType = &TypeError->super_PType;
      return &this->super_FxExpression;
    }
    local_40 = (FxExpression *)CONCAT44(local_40._4_4_,(this->Identifier).Index);
    this_01 = (DObject *)PSymbolTable::FindSymbol(&GlobalSymbols,(FName *)&local_40,true);
    pPVar3 = PSymbolConst::RegistrationInfo.MyClass;
    if (this_01 == (DObject *)0x0) {
      uVar6 = P_FindLineSpecial(FName::NameData.NameArray[(this->Identifier).Index].Text,(int *)0x0,
                                (int *)0x0);
      if (uVar6 != 0) {
        pFVar16 = &(this->super_FxExpression).ScriptPosition;
        FScriptPosition::Message
                  (pFVar16,8,"Resolving name \'%s\' as line special %d\n",
                   FName::NameData.NameArray[(this->Identifier).Index].Text,(ulong)uVar6);
        pFVar12 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x38);
        pFVar12->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
        FScriptPosition::FScriptPosition(&pFVar12->ScriptPosition,pFVar16);
        pFVar12->NeedResult = true;
        pFVar12->ExprType = EFX_Constant;
        pFVar12->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_0070d3e8;
        pPVar4 = TypeSInt32;
        pFVar12[1]._vptr_FxExpression = (_func_int **)TypeSInt32;
        pFVar12->ValueType = (PType *)pPVar4;
        *(uint *)&pFVar12[1].ScriptPosition.FileName.Chars = uVar6;
        pFVar12->isresolved = true;
        goto LAB_0052ec1d;
      }
      pFVar13 = FindCVar(FName::NameData.NameArray[(this->Identifier).Index].Text,(FBaseCVar **)0x0)
      ;
      if (pFVar13 != (FBaseCVar *)0x0) {
        if ((pFVar13->Flags & 2) == 0) {
          pFVar12 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x30);
          pFVar12->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
          FScriptPosition::FScriptPosition
                    (&pFVar12->ScriptPosition,&(this->super_FxExpression).ScriptPosition);
          pFVar12->ValueType = (PType *)0x0;
          pFVar12->isresolved = false;
          pFVar12->NeedResult = true;
          pFVar12->ExprType = EFX_CVar;
          pFVar12->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070c860;
          pFVar12[1]._vptr_FxExpression = (_func_int **)pFVar13;
          goto LAB_0052ec1d;
        }
        pcVar15 = "Cannot access userinfo CVARs directly. Use GetCVar() instead.";
        goto LAB_0052eb48;
      }
      pcVar15 = FName::NameData.NameArray[(this->Identifier).Index].Text;
      pcVar14 = "Unknown identifier \'%s\'";
    }
    else {
      pPVar8 = this_01->Class;
      if (pPVar8 == (PClass *)0x0) {
        iVar5 = (**this_01->_vptr_DObject)(this_01);
        pPVar8 = (PClass *)CONCAT44(extraout_var_02,iVar5);
        this_01->Class = pPVar8;
      }
      bVar17 = pPVar8 != (PClass *)0x0;
      if (pPVar8 != pPVar3 && bVar17) {
        do {
          pPVar8 = pPVar8->ParentClass;
          bVar17 = pPVar8 != (PClass *)0x0;
          if (pPVar8 == pPVar3) break;
        } while (pPVar8 != (PClass *)0x0);
      }
      if (bVar17) {
        pcVar15 = FName::NameData.NameArray[(this->Identifier).Index].Text;
        pcVar14 = "Resolving name \'%s\' as global constant\n";
        goto LAB_0052ec00;
      }
      bVar17 = DObject::IsKindOf(this_01,PField::RegistrationInfo.MyClass);
      pFVar16 = &(this->super_FxExpression).ScriptPosition;
      pcVar15 = FName::NameData.NameArray[(this->Identifier).Index].Text;
      if (bVar17) {
        FScriptPosition::Message(pFVar16,8,"Resolving name \'%s\' as global variable\n",pcVar15);
        pFVar12 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x38);
        pFVar12->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
        FScriptPosition::FScriptPosition(&pFVar12->ScriptPosition,pFVar16);
        pFVar12->ValueType = (PType *)0x0;
        pFVar12->isresolved = false;
        pFVar12->NeedResult = true;
        pFVar12->ExprType = EFX_GlobalVariable;
        pFVar12->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070c7f8;
        pFVar12[1]._vptr_FxExpression = (_func_int **)this_01;
        *(undefined2 *)&pFVar12[1].ScriptPosition.FileName.Chars = 0x100;
        goto LAB_0052ec1d;
      }
      pcVar14 = "Invalid global identifier \'%s\'\n";
    }
  }
  else {
    local_40 = (FxExpression *)CONCAT44(local_40._4_4_,(this->Identifier).Index);
    this_01 = (DObject *)
              PSymbolTable::FindSymbolInTable
                        (&(ctx->Class->super_PNamedType).super_PCompoundType.super_PType.Symbols,
                         (FName *)&local_40,(PSymbolTable **)local_38);
    pPVar3 = PSymbolConst::RegistrationInfo.MyClass;
    if (this_01 == (DObject *)0x0) goto LAB_0052ea8c;
    pPVar8 = this_01->Class;
    if (pPVar8 == (PClass *)0x0) {
      iVar5 = (**this_01->_vptr_DObject)(this_01);
      pPVar8 = (PClass *)CONCAT44(extraout_var_00,iVar5);
      this_01->Class = pPVar8;
    }
    bVar17 = pPVar8 != (PClass *)0x0;
    if (pPVar8 != pPVar3 && bVar17) {
      do {
        pPVar8 = pPVar8->ParentClass;
        bVar17 = pPVar8 != (PClass *)0x0;
        if (pPVar8 == pPVar3) break;
      } while (pPVar8 != (PClass *)0x0);
    }
    if (bVar17) {
      pcVar15 = FName::NameData.NameArray[(this->Identifier).Index].Text;
      pcVar14 = "Resolving name \'%s\' as class constant\n";
LAB_0052ec00:
      pFVar16 = &(this->super_FxExpression).ScriptPosition;
      FScriptPosition::Message(pFVar16,8,pcVar14,pcVar15);
      pFVar12 = FxConstant::MakeConstant((PSymbol *)this_01,pFVar16);
LAB_0052ec1d:
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      if (pFVar12 == (FxExpression *)0x0) {
        return &((FxIdentifier *)0x0)->super_FxExpression;
      }
      iVar5 = (*pFVar12->_vptr_FxExpression[2])(pFVar12,ctx);
      return &((FxIdentifier *)CONCAT44(extraout_var_03,iVar5))->super_FxExpression;
    }
    if ((((ctx->Function->Variants).Array)->SelfClass != ctx->Class) &&
       (bVar17 = DObject::IsKindOf(this_01,PField::RegistrationInfo.MyClass), bVar17)) {
      pFVar11 = (FxSelf *)FMemArena::Alloc(&FxAlloc,0x30);
      pFVar16 = &(this->super_FxExpression).ScriptPosition;
      (pFVar11->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
      FScriptPosition::FScriptPosition(&(pFVar11->super_FxExpression).ScriptPosition,pFVar16);
      (pFVar11->super_FxExpression).ValueType = (PType *)0x0;
      (pFVar11->super_FxExpression).isresolved = false;
      (pFVar11->super_FxExpression).NeedResult = true;
      (pFVar11->super_FxExpression).ExprType = EFX_Self;
      (pFVar11->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070c728;
      pFVar11->check = true;
      local_40 = FxSelf::Resolve(pFVar11,ctx);
      pFVar12 = ResolveMember(this,ctx,ctx->Class,&local_40,ctx->Class);
      if (pFVar12 != (FxExpression *)0x0) {
        FScriptPosition::Message
                  (pFVar16,3,"Self pointer used in ambiguous context; VM execution may abort!");
        ctx->Unsafe = true;
        goto LAB_0052ec1d;
      }
      goto LAB_0052eb54;
    }
    bVar17 = DObject::IsKindOf(this_01,PFunction::RegistrationInfo.MyClass);
    pcVar15 = FName::NameData.NameArray[(this->Identifier).Index].Text;
    pcVar14 = "Invalid member identifier \'%s\'.\n";
    if (bVar17) {
      pcVar14 = "Function \'%s\' used without ().\n";
    }
  }
  FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,pcVar14,pcVar15);
LAB_0052eb54:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return &((FxIdentifier *)0x0)->super_FxExpression;
}

Assistant:

FxExpression *FxIdentifier::Resolve(FCompileContext& ctx)
{
	PSymbol * sym;
	FxExpression *newex = nullptr;
	int num;
	
	CHECKRESOLVED();

	// Local variables have highest priority.
	FxLocalVariableDeclaration *local = ctx.FindLocalVariable(Identifier);
	if (local != nullptr)
	{
		if (local->ExprType == EFX_StaticArray)
		{
			auto x = new FxStaticArrayVariable(local, ScriptPosition);
			delete this;
			return x->Resolve(ctx);
		}
		else if (local->ValueType->GetRegType() != REGT_NIL)
		{
			auto x = new FxLocalVariable(local, ScriptPosition);
			delete this;
			return x->Resolve(ctx);
		}
		else
		{
			auto x = new FxStackVariable(local->ValueType, local->StackOffset, ScriptPosition);
			delete this;
			return x->Resolve(ctx);
		}
	}

	if (Identifier == NAME_Default)
	{
		if (ctx.Function->Variants[0].SelfClass == nullptr)
		{
			ScriptPosition.Message(MSG_ERROR, "Unable to access class defaults from static function");
			delete this;
			return nullptr;
		}
		if (!ctx.Function->Variants[0].SelfClass->IsKindOf(RUNTIME_CLASS(PClassActor)))
		{
			ScriptPosition.Message(MSG_ERROR, "'Default' requires an actor type.");
			delete this;
			return nullptr;
		}

		FxExpression * x = new FxClassDefaults(new FxSelf(ScriptPosition), ScriptPosition);
		delete this;
		return x->Resolve(ctx);
	}

	// Ugh, the horror. Constants need to be taken from the owning class, but members from the self class to catch invalid accesses here...
	// see if the current class (if valid) defines something with this name.
	PSymbolTable *symtbl;

	// first check fields in self
	if ((sym = ctx.FindInSelfClass(Identifier, symtbl)) != nullptr)
	{
		if (sym->IsKindOf(RUNTIME_CLASS(PField)))
		{
			FxExpression *self = new FxSelf(ScriptPosition);
			self = self->Resolve(ctx);
			newex = ResolveMember(ctx, ctx.Function->Variants[0].SelfClass, self, ctx.Function->Variants[0].SelfClass);
			ABORT(newex);
			goto foundit;
		}
	}

	// now check in the owning class.
	if (newex == nullptr && (sym = ctx.FindInClass(Identifier, symtbl)) != nullptr)
	{
		if (sym->IsKindOf(RUNTIME_CLASS(PSymbolConst)))
		{
			ScriptPosition.Message(MSG_DEBUGLOG, "Resolving name '%s' as class constant\n", Identifier.GetChars());
			newex = FxConstant::MakeConstant(sym, ScriptPosition);
			goto foundit;
		}
		// Do this check for ZScript as well, so that a clearer error message can be printed. MSG_OPTERROR will default to MSG_ERROR there.
		else if (ctx.Function->Variants[0].SelfClass != ctx.Class && sym->IsKindOf(RUNTIME_CLASS(PField)))
		{
			FxExpression *self = new FxSelf(ScriptPosition, true);
			self = self->Resolve(ctx);
			newex = ResolveMember(ctx, ctx.Class, self, ctx.Class);
			ABORT(newex);
			ScriptPosition.Message(MSG_OPTERROR, "Self pointer used in ambiguous context; VM execution may abort!");
			ctx.Unsafe = true;
			goto foundit;
		}
		else
		{
			if (sym->IsKindOf(RUNTIME_CLASS(PFunction)))
			{
				ScriptPosition.Message(MSG_ERROR, "Function '%s' used without ().\n", Identifier.GetChars());
			}
			else
			{
				ScriptPosition.Message(MSG_ERROR, "Invalid member identifier '%s'.\n", Identifier.GetChars());
			}
			delete this;
			return nullptr;
		}
	}

	if (noglobal)
	{
		// This is needed to properly resolve class names on the left side of the member access operator
		ValueType = TypeError;
		return this;
	}

	// now check the global identifiers.
	if (newex == nullptr && (sym = ctx.FindGlobal(Identifier)) != nullptr)
	{
		if (sym->IsKindOf(RUNTIME_CLASS(PSymbolConst)))
		{
			ScriptPosition.Message(MSG_DEBUGLOG, "Resolving name '%s' as global constant\n", Identifier.GetChars());
			newex = FxConstant::MakeConstant(sym, ScriptPosition);
			goto foundit;
		}
		else if (sym->IsKindOf(RUNTIME_CLASS(PField)))
		{
			// internally defined global variable
			ScriptPosition.Message(MSG_DEBUGLOG, "Resolving name '%s' as global variable\n", Identifier.GetChars());
			newex = new FxGlobalVariable(static_cast<PField *>(sym), ScriptPosition);
			goto foundit;
		}
		else
		{
			ScriptPosition.Message(MSG_ERROR, "Invalid global identifier '%s'\n", Identifier.GetChars());
			delete this;
			return nullptr;
		}
	}

	// and line specials
	if (newex == nullptr && (num = P_FindLineSpecial(Identifier, nullptr, nullptr)))
	{
		ScriptPosition.Message(MSG_DEBUGLOG, "Resolving name '%s' as line special %d\n", Identifier.GetChars(), num);
		newex = new FxConstant(num, ScriptPosition);
		goto foundit;
	}

	if (auto *cvar = FindCVar(Identifier.GetChars(), nullptr))
	{
		if (cvar->GetFlags() & CVAR_USERINFO)
		{
			ScriptPosition.Message(MSG_ERROR, "Cannot access userinfo CVARs directly. Use GetCVar() instead.");
			delete this;
			return nullptr;
		}
		newex = new FxCVar(cvar, ScriptPosition);
		goto foundit;
	}
	
	ScriptPosition.Message(MSG_ERROR, "Unknown identifier '%s'", Identifier.GetChars());
	delete this;
	return nullptr;

foundit:
	delete this;
	return newex? newex->Resolve(ctx) : nullptr;
}